

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_update_fg_62_var
               (int len,secp256k1_modinv64_signed62 *f,secp256k1_modinv64_signed62 *g,
               secp256k1_modinv64_trans2x2 *t)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uchar *puVar5;
  long lVar6;
  long lVar7;
  ulong unaff_RBX;
  undefined4 in_register_0000003c;
  uchar *out32;
  secp256k1_sha256 *psVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong unaff_R14;
  ulong unaff_R15;
  ulong uVar13;
  bool bVar14;
  byte bVar15;
  secp256k1_fe sStack_120;
  uchar *puStack_f0;
  secp256k1_sha256 *psStack_e8;
  uchar auStack_dc [4];
  secp256k1_sha256 sStack_d8;
  ulong uStack_70;
  ulong uStack_68;
  code *pcStack_60;
  int local_54;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  out32 = (uchar *)CONCAT44(in_register_0000003c,len);
  bVar15 = 0;
  if (len < 1) {
LAB_0011b90d:
    pcStack_60 = (code *)0x11b912;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0011b912:
    pcStack_60 = (code *)0x11b917;
    secp256k1_modinv64_update_fg_62_var_cold_1();
    uVar10 = unaff_R14;
LAB_0011b917:
    pcStack_60 = (code *)0x11b91c;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0011b91c:
    pcStack_60 = (code *)0x11b921;
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0011b921:
    pcStack_60 = (code *)0x11b926;
    secp256k1_modinv64_update_fg_62_var_cold_5();
    unaff_R14 = uVar10;
    uVar13 = unaff_R15;
  }
  else {
    local_38 = t->u;
    local_40 = t->v;
    lVar9 = f->v[0];
    lVar7 = g->v[0];
    uVar1 = lVar9 * local_38;
    lVar6 = SUB168(SEXT816(lVar9) * SEXT816(local_38),8);
    uVar2 = lVar7 * local_40;
    unaff_RBX = SUB168(SEXT816(lVar7) * SEXT816(local_40),8);
    uVar10 = (ulong)(~uVar2 < uVar1);
    lVar11 = (0x7fffffffffffffff - unaff_RBX) - lVar6;
    unaff_R14 = uVar1;
    uVar13 = ~uVar2;
    if ((SBORROW8(0x7fffffffffffffff - unaff_RBX,lVar6) != SBORROW8(lVar11,uVar10)) ==
        (long)(lVar11 - uVar10) < 0 || (long)unaff_RBX < 0) {
      local_48 = t->q;
      uVar13 = t->r;
      unaff_RBX = unaff_RBX + lVar6 + (ulong)CARRY8(uVar2,uVar1);
      uVar3 = lVar9 * local_48;
      unaff_R14 = SUB168(SEXT816(lVar9) * SEXT816(local_48),8);
      uVar4 = lVar7 * uVar13;
      lVar7 = SUB168(SEXT816(lVar7) * SEXT816((long)uVar13),8);
      uVar10 = (ulong)(-uVar4 - 1 < uVar3);
      lVar9 = (0x7fffffffffffffff - lVar7) - unaff_R14;
      local_50 = uVar13;
      if ((SBORROW8(0x7fffffffffffffff - lVar7,unaff_R14) != SBORROW8(lVar9,uVar10)) !=
          (long)(lVar9 - uVar10) < 0 && -1 < lVar7) goto LAB_0011b92b;
      lVar9 = lVar7 + unaff_R14 + (ulong)CARRY8(uVar4,uVar3);
      unaff_R15 = uVar13;
      if ((uVar2 + uVar1 & 0x3fffffffffffffff) != 0) goto LAB_0011b912;
      uVar10 = unaff_R14;
      if ((uVar4 + uVar3 & 0x3fffffffffffffff) != 0) goto LAB_0011b917;
      uVar3 = uVar4 + uVar3 >> 0x3e | lVar9 * 4;
      uVar1 = uVar2 + uVar1 >> 0x3e | unaff_RBX * 4;
      uVar10 = lVar9 >> 0x3e;
      unaff_RBX = (long)unaff_RBX >> 0x3e;
      local_54 = len;
      if (len != 1) {
        out32 = (uchar *)(ulong)(uint)len;
        puVar5 = (uchar *)0x1;
        do {
          unaff_R14 = f->v[(long)puVar5];
          unaff_R15 = unaff_R14 * local_38 + uVar1;
          lVar11 = SUB168(SEXT816((long)unaff_R14) * SEXT816(local_38),8) + unaff_RBX +
                   (ulong)CARRY8(unaff_R14 * local_38,uVar1);
          lVar9 = g->v[(long)puVar5];
          uVar1 = lVar9 * local_40;
          lVar7 = SUB168(SEXT816(lVar9) * SEXT816(local_40),8);
          if (-1 < lVar7) {
            unaff_RBX = -uVar1 - 1;
            lVar6 = (0x7fffffffffffffff - lVar7) - lVar11;
            if ((SBORROW8(0x7fffffffffffffff - lVar7,lVar11) !=
                SBORROW8(lVar6,(ulong)(unaff_RBX < unaff_R15))) ==
                (long)(lVar6 - (ulong)(unaff_RBX < unaff_R15)) < 0) goto LAB_0011b7fc;
LAB_0011b903:
            pcStack_60 = (code *)0x11b908;
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0011b908:
            pcStack_60 = (code *)0x11b90d;
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0011b90d;
          }
          lVar12 = (-0x8000000000000000 - lVar7) - (ulong)(uVar1 != 0);
          lVar6 = lVar11 - lVar12;
          unaff_RBX = lVar6 - (ulong)(unaff_R15 < -uVar1);
          if ((SBORROW8(lVar11,lVar12) != SBORROW8(lVar6,(ulong)(unaff_R15 < -uVar1))) !=
              (long)unaff_RBX < 0) goto LAB_0011b903;
LAB_0011b7fc:
          bVar14 = CARRY8(unaff_R15,uVar1);
          unaff_R15 = unaff_R15 + uVar1;
          lVar7 = lVar11 + lVar7 + (ulong)bVar14;
          unaff_RBX = unaff_R14 * local_48 + uVar3;
          unaff_R14 = SUB168(SEXT816((long)unaff_R14) * SEXT816(local_48),8) + uVar10 +
                      (ulong)CARRY8(unaff_R14 * local_48,uVar3);
          uVar10 = lVar9 * uVar13;
          lVar9 = SUB168(SEXT816(lVar9) * SEXT816((long)uVar13),8);
          if (lVar9 < 0) {
            lVar6 = (-0x8000000000000000 - lVar9) - (ulong)(uVar10 != 0);
            lVar11 = unaff_R14 - lVar6;
            if ((SBORROW8(unaff_R14,lVar6) != SBORROW8(lVar11,(ulong)(unaff_RBX < -uVar10))) !=
                (long)(lVar11 - (ulong)(unaff_RBX < -uVar10)) < 0) goto LAB_0011b908;
          }
          else {
            uVar1 = (ulong)(-uVar10 - 1 < unaff_RBX);
            lVar11 = (0x7fffffffffffffff - lVar9) - unaff_R14;
            if ((SBORROW8(0x7fffffffffffffff - lVar9,unaff_R14) != SBORROW8(lVar11,uVar1)) !=
                (long)(lVar11 - uVar1) < 0) goto LAB_0011b908;
          }
          lVar9 = unaff_R14 + lVar9 + (ulong)CARRY8(unaff_RBX,uVar10);
          uVar1 = lVar7 * 4 | unaff_R15 >> 0x3e;
          f->v[(long)(puVar5 + -1)] = unaff_R15 & 0x3fffffffffffffff;
          uVar3 = lVar9 * 4 | unaff_RBX + uVar10 >> 0x3e;
          g->v[(long)(puVar5 + -1)] = unaff_RBX + uVar10 & 0x3fffffffffffffff;
          puVar5 = puVar5 + 1;
          uVar10 = lVar9 >> 0x3e;
          unaff_RBX = lVar7 >> 0x3e;
          unaff_R15 = unaff_R15 & 0x3fffffffffffffff;
        } while (out32 != puVar5);
      }
      if ((unaff_RBX - 1) + (ulong)(0x7fffffffffffffff < uVar1) != -1) goto LAB_0011b91c;
      f->v[(long)len + -1] = uVar1;
      uVar10 = (uVar10 - 1) + (ulong)(0x7fffffffffffffff < uVar3);
      if (uVar10 == 0xffffffffffffffff) {
        g->v[(long)len + -1] = uVar3;
        return;
      }
      goto LAB_0011b921;
    }
  }
  pcStack_60 = (code *)0x11b92b;
  secp256k1_modinv64_update_fg_62_var_cold_8();
LAB_0011b92b:
  pcStack_60 = secp256k1_ellswift_prng;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psVar8 = &sStack_d8;
  uStack_70 = unaff_RBX;
  uStack_68 = unaff_R14;
  pcStack_60 = (code *)uVar13;
  for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(int64_t *)psVar8->s = f->v[0];
    f = (secp256k1_modinv64_signed62 *)((long)f + ((ulong)bVar15 * -2 + 1) * 8);
    psVar8 = (secp256k1_sha256 *)((long)psVar8 + (ulong)bVar15 * -0x10 + 8);
  }
  uVar13 = sStack_d8.bytes >> 6;
  psStack_e8 = (secp256k1_sha256 *)0x11b968;
  secp256k1_sha256_write(&sStack_d8,auStack_dc,4);
  psStack_e8 = (secp256k1_sha256 *)0x11b973;
  psVar8 = &sStack_d8;
  secp256k1_sha256_finalize(&sStack_d8,out32);
  if (sStack_d8.bytes >> 6 != uVar13 + 1) {
    psStack_e8 = (secp256k1_sha256 *)secp256k1_ge_x_on_curve_var;
    secp256k1_ellswift_prng_cold_1();
    puStack_f0 = out32;
    psStack_e8 = &sStack_d8;
    secp256k1_fe_sqr(&sStack_120,(secp256k1_fe *)psVar8);
    secp256k1_fe_mul(&sStack_120,&sStack_120,(secp256k1_fe *)psVar8);
    secp256k1_fe_verify(&sStack_120);
    sStack_120.n[0] = sStack_120.n[0] + 2;
    sStack_120.magnitude = sStack_120.magnitude + 1;
    sStack_120.normalized = 0;
    secp256k1_fe_verify(&sStack_120);
    secp256k1_fe_is_square_var(&sStack_120);
    return;
  }
  return;
}

Assistant:

static void secp256k1_modinv64_update_fg_62_var(int len, secp256k1_modinv64_signed62 *f, secp256k1_modinv64_signed62 *g, const secp256k1_modinv64_trans2x2 *t) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t fi, gi;
    secp256k1_int128 cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    secp256k1_i128_mul(&cf, u, fi);
    secp256k1_i128_accum_mul(&cf, v, gi);
    secp256k1_i128_mul(&cg, q, fi);
    secp256k1_i128_accum_mul(&cg, r, gi);
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cf) & M62) == 0); secp256k1_i128_rshift(&cf, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&cg) & M62) == 0); secp256k1_i128_rshift(&cg, 62);
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 62 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        secp256k1_i128_accum_mul(&cf, u, fi);
        secp256k1_i128_accum_mul(&cf, v, gi);
        secp256k1_i128_accum_mul(&cg, q, fi);
        secp256k1_i128_accum_mul(&cg, r, gi);
        f->v[i - 1] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
        g->v[i - 1] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = secp256k1_i128_to_i64(&cf);
    g->v[len - 1] = secp256k1_i128_to_i64(&cg);
}